

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O3

int MPIX_skewed_kdtree_cart_create
              (MPI_Comm old_comm,int *dims,int num_dims,int *stencil,int stencil_size,int *periods,
              MPI_Comm *cart_comm)

{
  int *factors;
  int *coordinate;
  ulong uVar1;
  size_t __nmemb;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  MPI_Comm sorted_comm;
  MPI_Comm tmp;
  int local_60;
  int local_5c;
  int *local_58;
  size_t local_50;
  int *local_48;
  MPI_Comm local_40;
  MPI_Comm local_38;
  
  local_48 = periods;
  mpireorderinglib::MPIX_Node_comm(old_comm,&local_40,(int *)0x0,(int *)0x0,NODES_MEAN);
  __nmemb = (size_t)num_dims;
  factors = (int *)malloc(__nmemb * 8);
  MPI_Comm_size(local_40,&local_5c);
  MPI_Comm_rank(local_40,&local_60);
  local_50 = __nmemb;
  coordinate = (int *)calloc(__nmemb,4);
  local_58 = (int *)malloc(__nmemb * 4);
  memcpy(local_58,dims,__nmemb * 4);
  uVar2 = (ulong)(uint)num_dims;
  if (0 < (int)local_50) {
    uVar1 = 0;
    do {
      factors[uVar1] = 0;
      if (0 < stencil_size) {
        iVar3 = 0;
        piVar4 = stencil;
        uVar5 = (ulong)(uint)stencil_size;
        do {
          if (*piVar4 != 0) {
            iVar3 = iVar3 + 1;
            factors[uVar1] = iVar3;
          }
          piVar4 = piVar4 + uVar2;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar1 = uVar1 + 1;
      stencil = stencil + 1;
    } while (uVar1 != uVar2);
  }
  skewed_find_node_recursive(local_58,num_dims,local_5c,local_60,coordinate,factors);
  iVar3 = *coordinate;
  if (1 < num_dims) {
    uVar1 = 1;
    do {
      iVar3 = iVar3 * dims[uVar1] + coordinate[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  MPI_Comm_split(local_40,0,iVar3,&local_38);
  iVar3 = MPI_Cart_create(local_38,num_dims,dims,local_48,0,cart_comm);
  MPI_Comm_free(&local_38);
  MPI_Comm_free(&local_40);
  free(factors);
  free(local_58);
  free(coordinate);
  return iVar3;
}

Assistant:

int
MPIX_skewed_kdtree_cart_create(MPI_Comm old_comm, const int *dims, int num_dims, const int *stencil, int stencil_size,
                               const int * const periods, MPI_Comm *cart_comm) {
    MPI_Comm sorted_comm;
    mpireorderinglib::MPIX_Node_comm(old_comm, &sorted_comm);
    int *factors = static_cast<int *>(malloc(num_dims * sizeof(double)));
    int world_size;
    MPI_Comm_size(sorted_comm, &world_size);
    int world_rank;
    MPI_Comm_rank(sorted_comm, &world_rank);

    int *coordinate = static_cast<int *>(calloc(num_dims, sizeof(int)));
    int *dims_heper = static_cast<int *>(malloc(num_dims * sizeof(int)));
    memcpy(dims_heper, dims, num_dims * sizeof(int));

    // calculating these factors is only used in the skewed kd-tree variant
    calculate_factors(factors, num_dims, stencil, stencil_size);
    // actual coordinate calculation
    skewed_find_node_recursive(dims_heper, num_dims, world_size, world_rank, coordinate, factors);

    int new_rank = coordinate[0];
    for (int i = 1; i < num_dims; i++) {
        new_rank = new_rank * dims[i] + coordinate[i];
    }

    MPI_Comm tmp;
    MPI_Comm_split(sorted_comm, 0, new_rank, &tmp);
    int err = MPI_Cart_create(tmp, num_dims, dims, periods, 0, cart_comm);
    MPI_Comm_free(&tmp);
    MPI_Comm_free(&sorted_comm);
    free(factors);
    free(dims_heper);
    free(coordinate);
    return err;
}